

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_sync.cpp
# Opt level: O1

void __thiscall
DSDcc::DSDSync::matchSome
          (DSDSync *this,uchar *start,int maxHistory,SyncPattern *patterns,int nbPatterns)

{
  uchar uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  this->m_syncErrors[0x17] = 0;
  this->m_syncErrors[0x18] = 0;
  this->m_syncErrors[0x19] = 0;
  this->m_syncErrors[0x1a] = 0;
  this->m_syncErrors[0x14] = 0;
  this->m_syncErrors[0x15] = 0;
  this->m_syncErrors[0x16] = 0;
  this->m_syncErrors[0x17] = 0;
  this->m_syncErrors[0x10] = 0;
  this->m_syncErrors[0x11] = 0;
  this->m_syncErrors[0x12] = 0;
  this->m_syncErrors[0x13] = 0;
  this->m_syncErrors[0xc] = 0;
  this->m_syncErrors[0xd] = 0;
  this->m_syncErrors[0xe] = 0;
  this->m_syncErrors[0xf] = 0;
  this->m_syncErrors[8] = 0;
  this->m_syncErrors[9] = 0;
  this->m_syncErrors[10] = 0;
  this->m_syncErrors[0xb] = 0;
  this->m_syncErrors[4] = 0;
  this->m_syncErrors[5] = 0;
  this->m_syncErrors[6] = 0;
  this->m_syncErrors[7] = 0;
  this->m_syncErrors[0] = 0;
  this->m_syncErrors[1] = 0;
  this->m_syncErrors[2] = 0;
  this->m_syncErrors[3] = 0;
  if (0 < maxHistory) {
    uVar2 = 0;
    do {
      if (0 < nbPatterns) {
        uVar1 = start[uVar2];
        uVar4 = 0;
        do {
          lVar3 = (long)(int)patterns[uVar4];
          if (((this->m_syncErrors[lVar3] <= *(uint *)(m_syncLenTol + lVar3 * 8 + 4)) &&
              ((&m_syncPatterns)[(long)(((int)uVar2 - maxHistory) + 0x20) + lVar3 * 0x20] != '\0'))
             && (uVar1 != (&m_syncPatterns)[(long)(((int)uVar2 - maxHistory) + 0x20) + lVar3 * 0x20]
                )) {
            this->m_syncErrors[lVar3] = this->m_syncErrors[lVar3] + 1;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)nbPatterns != uVar4);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)maxHistory);
  }
  return;
}

Assistant:

void DSDSync::matchSome(const unsigned char *start, int maxHistory, const SyncPattern *patterns, int nbPatterns)
{
    std::fill(m_syncErrors, m_syncErrors + m_patterns, 0);
    int pshift = m_history - maxHistory;

    for (int i = 0; i < maxHistory; i++)
    {
        unsigned char c = start[i];

        for (int ip = 0; ip < nbPatterns; ip++)
        {
            int p = (int) patterns[ip];

            if (m_syncErrors[p] > m_syncLenTol[p][1]) {
                continue;
            }
            if ((m_syncPatterns[p][i+pshift] != 0) && (c != m_syncPatterns[p][i+pshift])) {
                m_syncErrors[p]++;
            }
        }
    }
}